

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLElement::SetText(XMLElement *this,char *inText)

{
  int iVar1;
  XMLNode *pXVar2;
  undefined4 extraout_var;
  XMLDocument *this_00;
  XMLText *addThis;
  XMLText *theText;
  char *inText_local;
  XMLElement *this_local;
  
  pXVar2 = XMLNode::FirstChild(&this->super_XMLNode);
  if (pXVar2 != (XMLNode *)0x0) {
    pXVar2 = XMLNode::FirstChild(&this->super_XMLNode);
    iVar1 = (*pXVar2->_vptr_XMLNode[1])();
    if (CONCAT44(extraout_var,iVar1) != 0) {
      pXVar2 = XMLNode::FirstChild(&this->super_XMLNode);
      XMLNode::SetValue(pXVar2,inText,false);
      return;
    }
  }
  this_00 = XMLNode::GetDocument(&this->super_XMLNode);
  addThis = XMLDocument::NewText(this_00,inText);
  XMLNode::InsertFirstChild(&this->super_XMLNode,&addThis->super_XMLNode);
  return;
}

Assistant:

void	XMLElement::SetText( const char* inText )
{
	if ( FirstChild() && FirstChild()->ToText() )
		FirstChild()->SetValue( inText );
	else {
		XMLText*	theText = GetDocument()->NewText( inText );
		InsertFirstChild( theText );
	}
}